

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O1

int qEncodeNtlmString(QNtlmBuffer *buf,int offset,QString *s,bool unicode)

{
  quint16 qVar1;
  undefined3 in_register_00000009;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QArrayData *local_40 [2];
  ushort local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (CONCAT31(in_register_00000009,unicode) == 0) {
    QString::toLatin1_helper((QString *)local_40);
    buf->len = local_30;
    buf->maxLen = local_30;
    uVar2 = offset + 1U & 0xfffffffe;
    buf->offset = uVar2;
    uVar3 = (uint)local_30;
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],1,0x10);
      }
    }
  }
  else {
    uVar3 = (int)(s->d).size * 2;
    qVar1 = (quint16)uVar3;
    buf->len = qVar1;
    buf->maxLen = qVar1;
    uVar2 = offset + 1U & 0xfffffffe;
    buf->offset = uVar2;
    uVar3 = uVar3 & 0xffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar3 + uVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int qEncodeNtlmString(QNtlmBuffer& buf, int offset, const QString& s, bool unicode)
{
    if (!unicode)
        return qEncodeNtlmBuffer(buf, offset, s.toLatin1());
    buf.len = 2 * s.size();
    buf.maxLen = buf.len;
    buf.offset = (offset + 1) & ~1;
    return buf.offset + buf.len;
}